

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Acb_Ntk_t * Acb_VerilogSimpleRead(char *pFileName,char *pFileNameW)

{
  int nNameIdMax;
  Abc_Nam_t *pNames;
  Vec_Int_t *vBuffer;
  void *pModule;
  Vec_Int_t *vWeights;
  Acb_Ntk_t *pAVar1;
  Ndr_Data_t *p;
  char *__format;
  
  pNames = Acb_VerilogStartNames();
  vBuffer = Acb_VerilogSimpleLex(pFileName,pNames);
  if (vBuffer == (Vec_Int_t *)0x0) {
    pModule = (void *)0x0;
  }
  else {
    pModule = Acb_VerilogSimpleParse(vBuffer,pNames);
  }
  if (pFileNameW == (char *)0x0) {
    vWeights = (Vec_Int_t *)0x0;
  }
  else {
    vWeights = Acb_ReadWeightMap(pFileNameW,pNames);
  }
  if (pModule == (void *)0x0 && pFileName != (char *)0x0) {
    __format = "Cannot read input file \"%s\".\n";
  }
  else {
    if (vWeights != (Vec_Int_t *)0x0 || pFileNameW == (char *)0x0) {
      nNameIdMax = Abc_NamObjNumMax(pNames);
      pAVar1 = Acb_NtkFromNdr(pFileName,pModule,pNames,vWeights,nNameIdMax);
      if (pModule != (void *)0x0) {
        free(*(void **)((long)pModule + 8));
        free(*(void **)((long)pModule + 0x10));
        free(pModule);
      }
      if (vBuffer->pArray != (int *)0x0) {
        free(vBuffer->pArray);
      }
      free(vBuffer);
      if (vWeights != (Vec_Int_t *)0x0) {
        if (vWeights->pArray != (int *)0x0) {
          free(vWeights->pArray);
        }
        free(vWeights);
      }
      Abc_NamDeref(pNames);
      return pAVar1;
    }
    __format = "Cannot read weight file \"%s\".\n";
    pFileName = pFileNameW;
  }
  printf(__format,pFileName);
  return (Acb_Ntk_t *)0x0;
}

Assistant:

Acb_Ntk_t * Acb_VerilogSimpleRead( char * pFileName, char * pFileNameW )
{
    extern Acb_Ntk_t * Acb_NtkFromNdr( char * pFileName, void * pModule, Abc_Nam_t * pNames, Vec_Int_t * vWeights, int nNameIdMax );
    Acb_Ntk_t * pNtk;
    Abc_Nam_t * pNames = Acb_VerilogStartNames();
    Vec_Int_t * vBuffer = Acb_VerilogSimpleLex( pFileName, pNames );
    void * pModule = vBuffer ? Acb_VerilogSimpleParse( vBuffer, pNames ) : NULL;
    Vec_Int_t * vWeights = pFileNameW ? Acb_ReadWeightMap( pFileNameW, pNames ) : NULL;
    if ( pFileName && pModule == NULL )
    {
        printf( "Cannot read input file \"%s\".\n", pFileName );
        return NULL;
    }
    if ( pFileNameW && vWeights == NULL )
    {
        printf( "Cannot read weight file \"%s\".\n", pFileNameW );
        return NULL;
    }
//    Ndr_ModuleWriteVerilog( "iccad17/unit1/test.v", pModule, pNameStrs );
    pNtk = Acb_NtkFromNdr( pFileName, pModule, pNames, vWeights, Abc_NamObjNumMax(pNames) );
    Ndr_Delete( pModule );
    Vec_IntFree( vBuffer );
    Vec_IntFreeP( &vWeights );
    Abc_NamDeref( pNames );
    return pNtk;
}